

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeitems.cpp
# Opt level: O0

int AF_A_RemoveForceField(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  side_t *psVar1;
  bool bVar2;
  bool local_6e;
  bool local_6b;
  FNullTextureID local_68;
  FTextureID local_64;
  FNullTextureID local_60;
  FTextureID local_5c;
  line_t *local_58;
  line_t *line;
  int i;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeitems.cpp"
                  ,0x1a,"int AF_A_RemoveForceField(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_6b = true;
    if (stateowner != (AActor *)0x0) {
      local_6b = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_6b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeitems.cpp"
                    ,0x1a,
                    "int AF_A_RemoveForceField(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeitems.cpp"
                      ,0x1a,
                      "int AF_A_RemoveForceField(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_6e = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_6e = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_6e == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeitems.cpp"
                      ,0x1a,
                      "int AF_A_RemoveForceField(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeitems.cpp"
                      ,0x1a,
                      "int AF_A_RemoveForceField(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      _i = pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      _i = (void *)0x0;
    }
    operator~((int)&line + MF_SHOOTABLE);
    TFlags<ActorFlag,_unsigned_int>::operator&=(&stateowner->flags,(Self *)((long)&line + 4));
    for (line._0_4_ = 0; (int)line < stateowner->Sector->linecount; line._0_4_ = (int)line + 1) {
      local_58 = stateowner->Sector->lines[(int)line];
      if ((local_58->backsector != (sector_t *)0x0) && (local_58->special == 0x21)) {
        local_58->flags = local_58->flags & 0xffff7ffe;
        local_58->special = 0;
        psVar1 = local_58->sidedef[0];
        FNullTextureID::FNullTextureID(&local_60);
        local_5c = local_60.super_FTextureID.texnum;
        side_t::SetTexture(psVar1,1,local_60.super_FTextureID);
        psVar1 = local_58->sidedef[1];
        FNullTextureID::FNullTextureID(&local_68);
        local_64 = local_68.super_FTextureID.texnum;
        side_t::SetTexture(psVar1,1,local_68.super_FTextureID);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeitems.cpp"
                ,0x1a,"int AF_A_RemoveForceField(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveForceField)
{
	PARAM_ACTION_PROLOGUE;

	self->flags &= ~MF_SPECIAL;

	for (int i = 0; i < self->Sector->linecount; ++i)
	{
		line_t *line = self->Sector->lines[i];
		if (line->backsector != NULL && line->special == ForceField)
		{
			line->flags &= ~(ML_BLOCKING|ML_BLOCKEVERYTHING);
			line->special = 0;
			line->sidedef[0]->SetTexture(side_t::mid, FNullTextureID());
			line->sidedef[1]->SetTexture(side_t::mid, FNullTextureID());
		}
	}
	return 0;
}